

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_handler.cpp
# Opt level: O2

Token * __thiscall TokenReader::peek(Token *__return_storage_ptr__,TokenReader *this)

{
  long lVar1;
  
  __return_storage_ptr__->type = NONE_TYPE;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val)._M_string_length = 0;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  lVar1 = *(long *)this;
  if (lVar1 != *(long *)(this + 8)) {
    if ((ulong)(long)*(int *)(this + 0x18) < (ulong)((*(long *)(this + 8) - lVar1) / 0x28)) {
      Token::operator=(__return_storage_ptr__,(Token *)(lVar1 + (long)*(int *)(this + 0x18) * 0x28))
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Token TokenReader::peek()
{
    Token token;
    if (!m_tokenList.empty() && pos < m_tokenList.size()) {
        token = m_tokenList[pos];
    }
    return token;
}